

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int Configtable_insert(config *data)

{
  s_x4node **ppsVar1;
  s_x4node *psVar2;
  s_x4 *psVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  s_x4node *psVar8;
  s_x4node *psVar9;
  config *pcVar10;
  x4node *newnp;
  x4node *oldnp;
  s_x4 array;
  int size;
  int i;
  uint ph;
  uint h;
  x4node *np;
  config *data_local;
  
  if (x4a == (s_x4 *)0x0) {
    data_local._4_4_ = 0;
  }
  else {
    uVar4 = confighash(data);
    for (_ph = x4a->ht[uVar4 & x4a->size - 1U]; _ph != (s_x4node *)0x0; _ph = _ph->next) {
      iVar5 = Configcmp((char *)_ph->data,(char *)data);
      if (iVar5 == 0) {
        return 0;
      }
    }
    if (x4a->size <= x4a->count) {
      iVar6 = x4a->size * 2;
      iVar5 = x4a->count;
      psVar8 = (s_x4node *)calloc((long)iVar6,0x20);
      if (psVar8 == (s_x4node *)0x0) {
        return 0;
      }
      psVar9 = psVar8 + iVar6;
      for (array.ht._4_4_ = 0; array.ht._4_4_ < iVar6; array.ht._4_4_ = array.ht._4_4_ + 1) {
        (&psVar9->data)[array.ht._4_4_] = (config *)0x0;
      }
      for (array.ht._4_4_ = 0; array.ht._4_4_ < x4a->count; array.ht._4_4_ = array.ht._4_4_ + 1) {
        psVar2 = x4a->tbl;
        uVar7 = confighash(psVar2[array.ht._4_4_].data);
        uVar7 = uVar7 & iVar6 - 1U;
        pcVar10 = (config *)(psVar8 + array.ht._4_4_);
        if ((&psVar9->data)[uVar7] != (config *)0x0) {
          (&psVar9->data)[uVar7]->fws = (char *)&pcVar10->dot;
        }
        *(config **)&pcVar10->dot = (&psVar9->data)[uVar7];
        pcVar10->rp = (rule *)psVar2[array.ht._4_4_].data;
        pcVar10->fws = (char *)(&psVar9->data + uVar7);
        (&psVar9->data)[uVar7] = pcVar10;
      }
      free(x4a->tbl);
      psVar3 = x4a;
      psVar3->size = iVar6;
      psVar3->count = iVar5;
      psVar3->tbl = psVar8;
      psVar3->ht = (s_x4node **)psVar9;
    }
    uVar4 = uVar4 & x4a->size - 1U;
    ppsVar1 = &x4a->tbl;
    iVar5 = x4a->count;
    x4a->count = iVar5 + 1;
    psVar8 = *ppsVar1 + iVar5;
    psVar8->data = data;
    if (x4a->ht[uVar4] != (s_x4node *)0x0) {
      x4a->ht[uVar4]->from = &psVar8->next;
    }
    psVar8->next = x4a->ht[uVar4];
    x4a->ht[uVar4] = psVar8;
    psVar8->from = x4a->ht + uVar4;
    data_local._4_4_ = 1;
  }
  return data_local._4_4_;
}

Assistant:

int Configtable_insert(struct config *data)
{
  x4node *np;
  unsigned h;
  unsigned ph;

  if( x4a==0 ) return 0;
  ph = confighash(data);
  h = ph & (x4a->size-1);
  np = x4a->ht[h];
  while( np ){
    if( Configcmp((const char *) np->data,(const char *) data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x4a->count>=x4a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x4 array;
    array.size = size = x4a->size*2;
    array.count = x4a->count;
    array.tbl = (x4node*)calloc(size, sizeof(x4node) + sizeof(x4node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x4node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x4a->count; i++){
      x4node *oldnp, *newnp;
      oldnp = &(x4a->tbl[i]);
      h = confighash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x4a->tbl);
    *x4a = array;
  }
  /* Insert the new data */
  h = ph & (x4a->size-1);
  np = &(x4a->tbl[x4a->count++]);
  np->data = data;
  if( x4a->ht[h] ) x4a->ht[h]->from = &(np->next);
  np->next = x4a->ht[h];
  x4a->ht[h] = np;
  np->from = &(x4a->ht[h]);
  return 1;
}